

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int gen_publickey_from_ec_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,int is_sk,EVP_PKEY *pk)

{
  uchar *puVar1;
  int iVar2;
  uchar *str;
  char *str_00;
  uchar *puVar3;
  int iVar4;
  size_t sVar5;
  size_t len;
  size_t octal_len;
  uchar *p;
  size_t local_40;
  uchar *local_38;
  
  local_38 = (uchar *)((ulong)local_38 & 0xffffffff00000000);
  EVP_PKEY_get_int_param(pk,"bits",&local_38);
  iVar2 = 0x19f;
  if ((int)local_38 == 0x180) {
    iVar2 = 0x2cb;
  }
  iVar4 = 0x2cc;
  if ((int)local_38 != 0x209) {
    iVar4 = iVar2;
  }
  len = 0x22;
  if (is_sk == 0) {
    len = 0x13;
  }
  str = (uchar *)(*session->alloc)(len,&session->abstract);
  if (str == (uchar *)0x0) {
    iVar2 = _libssh2_error(session,-6,"out of memory");
    return iVar2;
  }
  if (is_sk == 0) {
    if (iVar4 == 0x2cc) {
      builtin_memcpy(str,"ecdsa-sha2-nistp521",0x13);
    }
    else if (iVar4 == 0x2cb) {
      builtin_memcpy(str,"ecdsa-sha2-nistp384",0x13);
    }
    else {
      if (iVar4 != 0x19f) goto LAB_0011b2bc;
      builtin_memcpy(str,"ecdsa-sha2-nistp256",0x13);
    }
  }
  else {
    builtin_memcpy(str,"sk-ecdsa-sha2-nistp256@openssh.com",0x22);
  }
  local_40 = 0x85;
  str_00 = (char *)(*session->alloc)(0x85,&session->abstract);
  EVP_PKEY_get_octet_string_param(pk,"pub",str_00,0x85,&local_40);
  sVar5 = len + local_40 + 0x14;
  puVar3 = (uchar *)(*session->alloc)(sVar5,&session->abstract);
  if (puVar3 != (uchar *)0x0) {
    local_38 = puVar3;
    _libssh2_store_str(&local_38,(char *)str,len);
    puVar1 = (uchar *)"ecdsa-sha2-nistp256";
    if (is_sk == 0) {
      puVar1 = str;
    }
    _libssh2_store_str(&local_38,(char *)(puVar1 + 0xb),8);
    _libssh2_store_str(&local_38,str_00,local_40);
    *method = str;
    if (method_len != (size_t *)0x0) {
      *method_len = len;
    }
    *pubkeydata = puVar3;
    if (pubkeydata_len != (size_t *)0x0) {
      *pubkeydata_len = sVar5;
    }
    if (str_00 == (char *)0x0) {
      return 0;
    }
    free(str_00);
    return 0;
  }
  if (str_00 != (char *)0x0) {
    free(str_00);
  }
LAB_0011b2bc:
  (*session->free)(str,&session->abstract);
  return -1;
}

Assistant:

static int
gen_publickey_from_ec_evp(LIBSSH2_SESSION *session,
                          unsigned char **method,
                          size_t *method_len,
                          unsigned char **pubkeydata,
                          size_t *pubkeydata_len,
                          int is_sk,
                          EVP_PKEY *pk)
{
    int rc = 0;
    unsigned char *p;
    unsigned char *method_buf = NULL;
    unsigned char *key;
    size_t  method_buf_len = 0;
    size_t  key_len = 0;
    unsigned char *octal_value = NULL;
    size_t octal_len;
    libssh2_curve_type type;

#ifdef USE_OPENSSL_3
    _libssh2_debug((session,
       LIBSSH2_TRACE_AUTH,
       "Computing public key from EC private key envelope"));

    type = _libssh2_ecdsa_get_curve_type(pk);
#else
    EC_KEY *ec = NULL;
    const EC_POINT *public_key;
    const EC_GROUP *group;
    BN_CTX *bn_ctx = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from EC private key envelope"));

    bn_ctx = BN_CTX_new();
    if(!bn_ctx)
        return -1;

    ec = EVP_PKEY_get1_EC_KEY(pk);
    if(!ec) {
        rc = -1;
        goto clean_exit;
    }

    public_key = EC_KEY_get0_public_key(ec);
    group = EC_KEY_get0_group(ec);
    type = _libssh2_ecdsa_get_curve_type(ec);
#endif

    if(is_sk)
        method_buf_len = 34;
    else
        method_buf_len = 19;

    method_buf = LIBSSH2_ALLOC(session, method_buf_len);
    if(!method_buf) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "out of memory");
    }

    if(is_sk) {
        memcpy(method_buf, "sk-ecdsa-sha2-nistp256@openssh.com",
               method_buf_len);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP256) {
        memcpy(method_buf, "ecdsa-sha2-nistp256", method_buf_len);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384) {
        memcpy(method_buf, "ecdsa-sha2-nistp384", method_buf_len);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521) {
        memcpy(method_buf, "ecdsa-sha2-nistp521", method_buf_len);
    }
    else {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_ERROR,
                       "Unsupported EC private key type"));
        rc = -1;
        goto clean_exit;
    }

#ifdef USE_OPENSSL_3
    octal_len = EC_MAX_POINT_LEN;
    octal_value = LIBSSH2_ALLOC(session, octal_len);
    EVP_PKEY_get_octet_string_param(pk, OSSL_PKEY_PARAM_PUB_KEY,
                                    octal_value, octal_len, &octal_len);
#else
    /* get length */
    octal_len = EC_POINT_point2oct(group, public_key,
                                   POINT_CONVERSION_UNCOMPRESSED,
                                   NULL, 0, bn_ctx);
    if(octal_len > EC_MAX_POINT_LEN) {
        rc = -1;
        goto clean_exit;
    }

    octal_value = malloc(octal_len);
    if(!octal_value) {
        rc = -1;
        goto clean_exit;
    }

    /* convert to octal */
    if(EC_POINT_point2oct(group, public_key, POINT_CONVERSION_UNCOMPRESSED,
       octal_value, octal_len, bn_ctx) != octal_len) {
        rc = -1;
        goto clean_exit;
    }
#endif

    /* Key form is: type_len(4) + type(method_buf_len) + domain_len(4)
       + domain(8) + pub_key_len(4) + pub_key(~65). */
    key_len = 4 + method_buf_len + 4 + 8 + 4 + octal_len;
    key = LIBSSH2_ALLOC(session, key_len);
    if(!key) {
        rc = -1;
        goto clean_exit;
    }

    /* Process key encoding. */
    p = key;

    /* Key type */
    _libssh2_store_str(&p, (const char *)method_buf, method_buf_len);

    /* Name domain */
    if(is_sk) {
        _libssh2_store_str(&p, "nistp256", 8);
    }
    else {
        _libssh2_store_str(&p, (const char *)method_buf + 11, 8);
    }

    /* Public key */
    _libssh2_store_str(&p, (const char *)octal_value, octal_len);

    *method = method_buf;
    if(method_len) {
        *method_len = method_buf_len;
    }
    *pubkeydata = key;
    if(pubkeydata_len) {
        *pubkeydata_len = key_len;
    }

clean_exit:

#ifndef USE_OPENSSL_3
    if(ec)
        EC_KEY_free(ec);

    if(bn_ctx) {
        BN_CTX_free(bn_ctx);
    }
#endif

    if(octal_value)
        free(octal_value);

    if(rc == 0)
        return 0;

    if(method_buf)
        LIBSSH2_FREE(session, method_buf);

    return -1;
}